

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_abi(lua_State *L)

{
  int iVar1;
  GCstr *str;
  
  str = lj_lib_checkstr(L,1);
  iVar1 = lj_cparse_case(str,"\x0564bit\x03fpu\x06hardfp\x02le");
  iVar1 = -3 - (iVar1 >> 0x1f);
  *(int *)((long)L->top + -4) = iVar1;
  *(int *)((ulong)(L->glref).ptr32 + 0x124) = iVar1;
  return 1;
}

Assistant:

LJLIB_CF(ffi_abi)	LJLIB_REC(.)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int b = lj_cparse_case(s,
#if LJ_64
    "\00564bit"
#else
    "\00532bit"
#endif
#if LJ_ARCH_HASFPU
    "\003fpu"
#endif
#if LJ_ABI_SOFTFP
    "\006softfp"
#else
    "\006hardfp"
#endif
#if LJ_ABI_EABI
    "\004eabi"
#endif
#if LJ_ABI_WIN
    "\003win"
#endif
#if LJ_TARGET_UWP
    "\003uwp"
#endif
#if LJ_LE
    "\002le"
#else
    "\002be"
#endif
#if LJ_GC64
    "\004gc64"
#endif
  ) >= 0;
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}